

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdoc.c
# Opt level: O3

void prvTidyCleanGoogleDocument(TidyDocImpl *doc)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Bool BVar4;
  TidyTagId TVar5;
  Stack *stack;
  AttVal *pAVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node **ppNVar9;
  
  stack = prvTidynewStack(doc,0x10);
  pNVar7 = (doc->root).content;
  if (pNVar7 != (Node *)0x0) {
    do {
      pNVar8 = pNVar7->next;
      BVar4 = prvTidynodeIsElement(pNVar7);
      if (BVar4 == no) goto LAB_00154ad4;
      if (pNVar7->tag == (Dict *)0x0) {
LAB_00154a23:
        if (pNVar7->attributes != (AttVal *)0x0) {
          prvTidyDropAttrByName(doc,pNVar7,"class");
        }
        prvTidypush(stack,pNVar8);
        pNVar7 = pNVar7->content;
      }
      else {
        TVar5 = pNVar7->tag->id;
        if (TVar5 == TidyTag_STYLE) {
          prvTidyDiscardElement(doc,pNVar7);
          if (pNVar7->tag == (Dict *)0x0) goto LAB_00154a23;
          TVar5 = pNVar7->tag->id;
        }
        if (TVar5 == TidyTag_A) {
          if (pNVar7->content == (Node *)0x0) {
            pAVar6 = prvTidyGetAttrByName(pNVar7,"name");
            if ((pAVar6 != (AttVal *)0x0) ||
               (pAVar6 = prvTidyGetAttrByName(pNVar7,anon_var_dwarf_54c88 + 0x2b),
               pAVar6 != (AttVal *)0x0)) {
              prvTidyRepairAttrValue(doc,pNVar7->parent,anon_var_dwarf_54c88 + 0x2b,pAVar6->value);
            }
LAB_00154a93:
            prvTidyDiscardElement(doc,pNVar7);
            goto LAB_00154ad4;
          }
          goto LAB_00154a23;
        }
        if (TVar5 != TidyTag_SPAN) {
          if ((TVar5 == TidyTag_P) && (pNVar7->content == (Node *)0x0)) goto LAB_00154a93;
          goto LAB_00154a23;
        }
        pNVar8 = pNVar7->content;
        if (pNVar8 == (Node *)0x0) {
          pNVar8 = prvTidyDiscardElement(doc,pNVar7);
        }
        else {
          pNVar1 = pNVar7->parent;
          pNVar2 = pNVar7->next;
          pNVar3 = pNVar7->last;
          ppNVar9 = &pNVar2->prev;
          if (pNVar2 == (Node *)0x0) {
            ppNVar9 = &pNVar1->last;
          }
          pNVar3->next = pNVar2;
          *ppNVar9 = pNVar3;
          if (pNVar7->prev == (Node *)0x0) {
            ppNVar9 = &pNVar1->content;
          }
          else {
            pNVar8->prev = pNVar7->prev;
            ppNVar9 = &pNVar7->prev->next;
          }
          *ppNVar9 = pNVar8;
          pNVar8 = pNVar7->content;
          for (pNVar2 = pNVar8; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->next) {
            pNVar2->parent = pNVar1;
          }
          pNVar7->next = (Node *)0x0;
          pNVar7->content = (Node *)0x0;
          prvTidyFreeNode(doc,pNVar7);
        }
LAB_00154ad4:
        pNVar7 = pNVar8;
        if (pNVar8 == (Node *)0x0) {
          pNVar7 = prvTidypop(stack);
        }
      }
    } while (pNVar7 != (Node *)0x0);
    prvTidyfreeStack(stack);
  }
  pNVar7 = prvTidyFindHEAD(doc);
  if (pNVar7 != (Node *)0x0) {
    pNVar8 = prvTidyInferredTag(doc,TidyTag_META);
    prvTidyAddAttribute(doc,pNVar8,"http-equiv","Content-Type");
    prvTidyAddAttribute(doc,pNVar8,"content","text/html; charset=UTF-8");
    prvTidyInsertNodeAtStart(pNVar7,pNVar8);
    return;
  }
  return;
}

Assistant:

void TY_(CleanGoogleDocument)( TidyDocImpl* doc )
{
    /* placeholder.  CleanTree()/CleanNode() will not
    ** zap root element 
    */
    CleanNode( doc, &doc->root );
    SetUTF8( doc );
}